

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vli_encoder.c
# Opt level: O0

lzma_ret lzma_vli_encode(lzma_vli vli,size_t *vli_pos,uint8_t *out,size_t *out_pos,size_t out_size)

{
  long lVar1;
  uint8_t local_40 [8];
  size_t vli_pos_internal;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  size_t *vli_pos_local;
  lzma_vli vli_local;
  
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  if (vli_pos == (size_t *)0x0) {
    out_local = local_40;
    if (out_size <= *out_pos) {
      return LZMA_PROG_ERROR;
    }
  }
  else {
    out_local = (uint8_t *)vli_pos;
    if (out_size <= *out_pos) {
      return LZMA_BUF_ERROR;
    }
  }
  if ((*(ulong *)out_local < 9) && (vli < 0x8000000000000000)) {
    vli_pos_local = (size_t *)(vli >> ((char)*(undefined8 *)out_local * '\a' & 0x3fU));
    vli_pos_internal = out_size;
    out_size_local = (size_t)out_pos;
    out_pos_local = (size_t *)out;
    do {
      if (vli_pos_local < (size_t *)0x80) {
        *(char *)((long)out_pos_local + *(long *)out_size_local) = (char)vli_pos_local;
        *(long *)out_size_local = *(long *)out_size_local + 1;
        *(long *)out_local = *(long *)out_local + 1;
        return (uint)(out_local != local_40);
      }
      *(long *)out_local = *(long *)out_local + 1;
      if (8 < *(ulong *)out_local) {
        __assert_fail("*vli_pos < LZMA_VLI_BYTES_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/vli_encoder.c"
                      ,0x33,
                      "lzma_ret lzma_vli_encode(lzma_vli, size_t *, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      *(byte *)((long)out_pos_local + *(long *)out_size_local) = (byte)vli_pos_local | 0x80;
      vli_pos_local = (size_t *)((ulong)vli_pos_local >> 7);
      lVar1 = *(long *)out_size_local;
      *(size_t *)out_size_local = lVar1 + 1U;
    } while (lVar1 + 1U != vli_pos_internal);
    vli_local._4_4_ = LZMA_OK;
    if (out_local == local_40) {
      vli_local._4_4_ = LZMA_PROG_ERROR;
    }
  }
  else {
    vli_local._4_4_ = LZMA_PROG_ERROR;
  }
  return vli_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_vli_encode(lzma_vli vli, size_t *vli_pos,
		uint8_t *restrict out, size_t *restrict out_pos,
		size_t out_size)
{
	// If we haven't been given vli_pos, work in single-call mode.
	size_t vli_pos_internal = 0;
	if (vli_pos == NULL) {
		vli_pos = &vli_pos_internal;

		// In single-call mode, we expect that the caller has
		// reserved enough output space.
		if (*out_pos >= out_size)
			return LZMA_PROG_ERROR;
	} else {
		// This never happens when we are called by liblzma, but
		// may happen if called directly from an application.
		if (*out_pos >= out_size)
			return LZMA_BUF_ERROR;
	}

	// Validate the arguments.
	if (*vli_pos >= LZMA_VLI_BYTES_MAX || vli > LZMA_VLI_MAX)
		return LZMA_PROG_ERROR;

	// Shift vli so that the next bits to encode are the lowest. In
	// single-call mode this never changes vli since *vli_pos is zero.
	vli >>= *vli_pos * 7;

	// Write the non-last bytes in a loop.
	while (vli >= 0x80) {
		// We don't need *vli_pos during this function call anymore,
		// but update it here so that it is ready if we need to
		// return before the whole integer has been decoded.
		++*vli_pos;
		assert(*vli_pos < LZMA_VLI_BYTES_MAX);

		// Write the next byte.
		out[*out_pos] = (uint8_t)(vli) | 0x80;
		vli >>= 7;

		if (++*out_pos == out_size)
			return vli_pos == &vli_pos_internal
					? LZMA_PROG_ERROR : LZMA_OK;
	}

	// Write the last byte.
	out[*out_pos] = (uint8_t)(vli);
	++*out_pos;
	++*vli_pos;

	return vli_pos == &vli_pos_internal ? LZMA_OK : LZMA_STREAM_END;

}